

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

CBString * compressionTypeToUString(CBString *__return_storage_ptr__,UINT8 algorithm)

{
  UINT8 algorithm_local;
  
  switch(algorithm) {
  case '\x01':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"None");
    break;
  case '\x02':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"EFI 1.1");
    break;
  case '\x03':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Tiano");
    break;
  case '\x04':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Undecided Tiano/EFI 1.1");
    break;
  case '\x05':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"LZMA");
    break;
  case '\x06':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Intel legacy LZMA");
    break;
  case '\a':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"LZMAF86");
    break;
  case '\b':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"GZip");
    break;
  case '\t':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Zlib");
    break;
  default:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",(ulong)algorithm);
  }
  return __return_storage_ptr__;
}

Assistant:

UString compressionTypeToUString(const UINT8 algorithm)
{
    switch (algorithm) {
        case COMPRESSION_ALGORITHM_NONE:                    return UString("None");
        case COMPRESSION_ALGORITHM_EFI11:                   return UString("EFI 1.1");
        case COMPRESSION_ALGORITHM_TIANO:                   return UString("Tiano");
        case COMPRESSION_ALGORITHM_UNDECIDED:               return UString("Undecided Tiano/EFI 1.1");
        case COMPRESSION_ALGORITHM_LZMA:                    return UString("LZMA");
        case COMPRESSION_ALGORITHM_LZMA_INTEL_LEGACY:       return UString("Intel legacy LZMA");
        case COMPRESSION_ALGORITHM_LZMAF86:                 return UString("LZMAF86");
        case COMPRESSION_ALGORITHM_GZIP:                    return UString("GZip");
        case COMPRESSION_ALGORITHM_ZLIB:                    return UString("Zlib");
    }
    
    return usprintf("Unknown %02Xh", algorithm);
}